

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O2

Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT> * __thiscall
wasm::WATParser::ParseTypeDefsCtx::getHeapTypeFromIdx
          (Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>
           *__return_storage_ptr__,ParseTypeDefsCtx *this,Index idx)

{
  size_t sVar1;
  string local_68;
  Err local_48;
  allocator<char> local_21;
  
  sVar1 = TypeBuilder::size(this->builder);
  if (idx < sVar1) {
    local_48.msg._M_dataplus._M_p = (pointer)this->builder;
    local_48.msg._M_string_length = (ulong)idx;
    std::__detail::__variant::
    _Variant_storage<false,wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,wasm::Err>
    ::_Variant_storage<0ul,wasm::TypeBuilder::Entry>
              ((_Variant_storage<false,wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,wasm::Err>
                *)__return_storage_ptr__);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"type index out of bounds",&local_21);
    Lexer::err(&local_48,&this->in,&local_68);
    std::__detail::__variant::
    _Variant_storage<false,wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,wasm::Err>
    ::_Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,wasm::Err>
                *)__return_storage_ptr__,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<HeapTypeT> getHeapTypeFromIdx(Index idx) {
    if (idx >= builder.size()) {
      return in.err("type index out of bounds");
    }
    return builder[idx];
  }